

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValueTest.cpp
# Opt level: O1

void __thiscall
TEST_ComparatorsAndCopiersRepository_ComparatorAndCopierByTheSameNameShouldBothBeFound_TestShell::
~TEST_ComparatorsAndCopiersRepository_ComparatorAndCopierByTheSameNameShouldBothBeFound_TestShell
          (TEST_ComparatorsAndCopiersRepository_ComparatorAndCopierByTheSameNameShouldBothBeFound_TestShell
           *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(ComparatorsAndCopiersRepository, ComparatorAndCopierByTheSameNameShouldBothBeFound)
{
  MyComparator comparator;
  MyCopier copier;
  MockNamedValueComparatorsAndCopiersRepository repository;
  repository.installCopier("MyType", copier);
  repository.installComparator("MyType", comparator);
  POINTERS_EQUAL(&comparator, repository.getComparatorForType("MyType"));
  POINTERS_EQUAL(&copier, repository.getCopierForType("MyType"));
  repository.clear();
}